

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_caster_base.h
# Opt level: O0

void __thiscall
pybind11::detail::loader_life_support::loader_life_support(loader_life_support *this)

{
  loader_life_support *plVar1;
  loader_life_support *this_local;
  
  plVar1 = get_stack_top();
  this->parent = plVar1;
  std::
  unordered_set<_object_*,_std::hash<_object_*>,_std::equal_to<_object_*>,_std::allocator<_object_*>_>
  ::unordered_set(&this->keep_alive);
  set_stack_top(this);
  return;
}

Assistant:

loader_life_support() : parent{get_stack_top()} { set_stack_top(this); }